

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_zpz_ool(DisasContext_conflict1 *s,arg_rpr_esz *a,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  
  if (fn != (undefined1 *)0x0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      tcg_gen_gvec_3_ool_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->pg * 0x20 + 0x2c10,
                 s->sve_len,s->sve_len,0,(gen_helper_gvec_3_conflict1 *)fn);
    }
  }
  return fn != (undefined1 *)0x0;
}

Assistant:

static bool do_zpz_ool(DisasContext *s, arg_rpr_esz *a, gen_helper_gvec_3 *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (fn == NULL) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           pred_full_reg_offset(s, a->pg),
                           vsz, vsz, 0, fn);
    }
    return true;
}